

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * QLocale::scriptToCode(QString *__return_storage_ptr__,Script script)

{
  uchar *puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = 0xff71 < (script - 0x8f & 0xffff);
  puVar1 = (uchar *)0x0;
  if (bVar2) {
    puVar1 = "ZzzzAdlmAhomHluwArabArmnAvstBaliBamuBengBassBatkBhksBopoBrahBraiBugiBuhdCansCariAghbCakmChamCherCoptXsuxCprtCyrlDsrtDevaDuplEgypElbaEthiLisuGeorGlagGothGranGrekGujrGuruHangHaniHanoHanbHatrHebrHiraArmiPhliPrtiJamoJpanJavaKthiKndaKanaKaliKharKhmrKhojSindKoreLanaLaooLatnLepcLimbLinaLinbLyciLydiMahjMlymMandManiMarcMteiMendMercMeroModiMongMrooMultMymrNbatNewaTaluNkooOryaOgamOlckHungItalNarbPermXpeoSarbOrkhOsgeOsmaHmngPalmPaucPhagPhnxPlrdPhlpRjngRunrSamrSaurShrdShawSiddSgnwHansSinhSoraSundSyloSyrcTglgTagbTaleTavtTakrTamlTangTeluThaaThaiTibtTfngTirhHantUgarVaiiWaraYiiiRohg"
             + (ulong)(script & 0x3fff) * 4;
  }
  ba.m_data = (storage_type *)
              (
              "ZzzzAdlmAhomHluwArabArmnAvstBaliBamuBengBassBatkBhksBopoBrahBraiBugiBuhdCansCariAghbCakmChamCherCoptXsuxCprtCyrlDsrtDevaDuplEgypElbaEthiLisuGeorGlagGothGranGrekGujrGuruHangHaniHanoHanbHatrHebrHiraArmiPhliPrtiJamoJpanJavaKthiKndaKanaKaliKharKhmrKhojSindKoreLanaLaooLatnLepcLimbLinaLinbLyciLydiMahjMlymMandManiMarcMteiMendMercMeroModiMongMrooMultMymrNbatNewaTaluNkooOryaOgamOlckHungItalNarbPermXpeoSarbOrkhOsgeOsmaHmngPalmPaucPhagPhnxPlrdPhlpRjngRunrSamrSaurShrdShawSiddSgnwHansSinhSoraSundSyloSyrcTglgTagbTaleTavtTakrTamlTangTeluThaaThaiTibtTfngTirhHantUgarVaiiWaraYiiiRohg"
              + (ulong)(script & 0x3fff) * 4);
  ba.m_size = (qsizetype)puVar1;
  QString::fromLatin1(&local_38,(QString *)((ulong)bVar2 << 2),ba);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_38.d.size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::scriptToCode(Script script)
{
    return QLocalePrivate::scriptToCode(script);
}